

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::PromiseIoStream::pumpTo
          (PromiseIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncIoStream *pAVar1;
  Own<kj::AsyncIoStream> *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  Promise<unsigned_long> PVar3;
  AsyncOutputStream *local_58;
  uint64_t local_50;
  Own<kj::AsyncIoStream> *local_48;
  Type local_40;
  Own<kj::AsyncIoStream> *s;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  PromiseIoStream *this_local;
  
  s = in_RCX;
  amount_local = amount;
  output_local = output;
  this_local = this;
  local_40.amount =
       (uint64_t)_::readMaybe<kj::AsyncIoStream>((Maybe<kj::Own<kj::AsyncIoStream>_> *)(output + 5))
  ;
  if ((Own<kj::AsyncIoStream> *)local_40.amount == (Own<kj::AsyncIoStream> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_40);
    local_50 = amount_local;
    local_48 = s;
    local_58 = output;
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)this,&local_40,(PropagateException *)&local_58);
    Promise<void>::~Promise((Promise<void> *)&local_40);
    pPVar2 = extraout_RDX_00;
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream>::get((Own<kj::AsyncIoStream> *)local_40.amount);
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[3])(this,pAVar1,amount_local,s);
    pPVar2 = extraout_RDX;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }